

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

int SimpleString::StrNCmp(char *s1,char *s2,size_t n)

{
  byte bVar1;
  size_t sVar2;
  
  sVar2 = 0;
  while( true ) {
    if (n == sVar2) {
      return 0;
    }
    bVar1 = s1[sVar2];
    if ((bVar1 == 0) || (bVar1 != s2[sVar2])) break;
    sVar2 = sVar2 + 1;
  }
  return (uint)bVar1 - (uint)(byte)s2[sVar2];
}

Assistant:

int SimpleString::StrNCmp(const char* s1, const char* s2, size_t n)
{
    while (n && *s1 && *s1 == *s2) {
        n--, s1++, s2++;
    }
    return n ? *(unsigned char *) s1 - *(unsigned char *) s2 : 0;
}